

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::FindLast
          (SkipList<unsigned_long,_leveldb::Comparator> *this)

{
  Node *pNVar1;
  Node *this_00;
  int n;
  bool bVar2;
  
  n = (this->max_height_).super___atomic_base<int>._M_i + -1;
  pNVar1 = this->head_;
  do {
    do {
      this_00 = pNVar1;
      pNVar1 = Node::Next(this_00,n);
    } while (pNVar1 != (Node *)0x0);
    bVar2 = n != 0;
    n = n + -1;
    pNVar1 = this_00;
  } while (bVar2);
  return this_00;
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::FindLast()
    const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (next == nullptr) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}